

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dp.cpp
# Opt level: O3

int si9ma::DP::save_money_dp(int *arr,int length,int index,int target)

{
  ulong uVar1;
  bool bVar2;
  size_t __n;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  undefined4 *puVar7;
  undefined4 *__s;
  undefined4 *__s_00;
  ulong uVar8;
  bool bVar9;
  undefined8 uStack_60;
  int aiStack_58 [2];
  int *local_50;
  undefined1 *local_48;
  size_t local_40;
  uint local_34;
  
  iVar3 = 0;
  if (((index < length) && (iVar3 = 0, arr != (int *)0x0)) && (-1 < index)) {
    local_48 = (undefined1 *)aiStack_58;
    uVar8 = (ulong)(target + 1);
    uVar4 = uVar8 * 4 + 0xf & 0xfffffffffffffff0;
    __s = (undefined4 *)((long)aiStack_58 - uVar4);
    __s_00 = (undefined4 *)((long)__s - uVar4);
    bVar9 = false;
    local_50 = arr;
    local_40 = uVar8 * 4;
    local_34 = length;
    *(undefined8 *)(__s_00 + -2) = 0x10e735;
    memset(__s,0,uVar8 * 4);
    __n = local_40;
    *(undefined8 *)(__s_00 + -2) = 0x10e743;
    memset(__s_00,0,__n);
    *__s = 1;
    uVar4 = (ulong)local_34;
    do {
      if (-1 < target) {
        iVar3 = local_50[uVar4 - 1];
        uVar5 = 0;
        do {
          uVar1 = (uint)-iVar3 + uVar5;
          if (bVar9) {
            if ((int)uVar1 < 0) {
              iVar6 = 0;
            }
            else {
              iVar6 = __s[uVar1 & 0xffffffff];
            }
            iVar6 = iVar6 + __s_00[uVar5];
            puVar7 = __s;
          }
          else {
            if ((int)uVar1 < 0) {
              iVar6 = 0;
            }
            else {
              iVar6 = __s_00[uVar1 & 0xffffffff];
            }
            iVar6 = iVar6 + __s[uVar5];
            puVar7 = __s_00;
          }
          puVar7[uVar5] = iVar6;
          uVar5 = uVar5 + 1;
        } while (uVar8 != uVar5);
      }
      bVar9 = (bool)(bVar9 ^ 1);
      bVar2 = 1 < (long)uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar2);
    if ((local_34 & 1) != 0) {
      __s = __s_00;
    }
    iVar3 = __s[target];
  }
  return iVar3;
}

Assistant:

int DP::save_money_dp(int *arr, int length, int index, int target) {
        if (arr == nullptr || index < 0 || index >= length)
            return 0;

        int res_arr1[target + 1];
        int res_arr2[target + 1];
        memset(res_arr1,0, sizeof(res_arr1));
        memset(res_arr2,0, sizeof(res_arr2));
        bool is_first_main = false;
        res_arr1[0] = 1;

        for (int i = length - 1 ; i >= 0 ; --i) {
            for (int j = 0; j <= target; ++j) {
                if (is_first_main)
                    res_arr1[j] = res_arr2[j] + (j - arr[i] < 0 ? 0 : res_arr1[j - arr[i]]);
                else
                    res_arr2[j] = res_arr1[j] + (j - arr[i] < 0 ? 0:  res_arr2[j - arr[i]]);
            }

            is_first_main = !is_first_main;
        }

        return is_first_main ? res_arr2[target] : res_arr1[target];
    }